

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence_helpers.cpp
# Opt level: O2

Loop * __thiscall
spvtools::opt::LoopDependenceAnalysis::GetLoopForSubscriptPair
          (LoopDependenceAnalysis *this,
          pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *subscript_pair)

{
  Loop *pLVar1;
  pointer ppSVar2;
  vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  destination_nodes;
  vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  source_nodes;
  Loop *local_b0;
  _Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  local_a8;
  _Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  local_90;
  _Hashtable<const_spvtools::opt::Loop_*,_const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>,_std::__detail::_Identity,_std::equal_to<const_spvtools::opt::Loop_*>,_std::hash<const_spvtools::opt::Loop_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_78;
  string local_40;
  
  SENode::CollectRecurrentNodes
            ((vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
              *)&local_90,subscript_pair->first);
  SENode::CollectRecurrentNodes
            ((vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
              *)&local_a8,subscript_pair->second);
  local_78._M_buckets = &local_78._M_single_bucket;
  local_78._M_bucket_count = 1;
  local_78._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_78._M_element_count = 0;
  local_78._M_rehash_policy._M_max_load_factor = 1.0;
  local_78._M_rehash_policy._4_4_ = 0;
  local_78._M_rehash_policy._M_next_resize = 0;
  local_78._M_single_bucket = (__node_base_ptr)0x0;
  for (ppSVar2 = local_90._M_impl.super__Vector_impl_data._M_start;
      ppSVar2 != local_90._M_impl.super__Vector_impl_data._M_finish; ppSVar2 = ppSVar2 + 1) {
    local_b0 = (*ppSVar2)->loop_;
    std::__detail::
    _Insert<const_spvtools::opt::Loop_*,_const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>,_std::__detail::_Identity,_std::equal_to<const_spvtools::opt::Loop_*>,_std::hash<const_spvtools::opt::Loop_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
    ::insert((_Insert<const_spvtools::opt::Loop_*,_const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>,_std::__detail::_Identity,_std::equal_to<const_spvtools::opt::Loop_*>,_std::hash<const_spvtools::opt::Loop_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
              *)&local_78,&local_b0);
  }
  for (ppSVar2 = local_a8._M_impl.super__Vector_impl_data._M_start;
      ppSVar2 != local_a8._M_impl.super__Vector_impl_data._M_finish; ppSVar2 = ppSVar2 + 1) {
    local_b0 = (*ppSVar2)->loop_;
    std::__detail::
    _Insert<const_spvtools::opt::Loop_*,_const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>,_std::__detail::_Identity,_std::equal_to<const_spvtools::opt::Loop_*>,_std::hash<const_spvtools::opt::Loop_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
    ::insert((_Insert<const_spvtools::opt::Loop_*,_const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>,_std::__detail::_Identity,_std::equal_to<const_spvtools::opt::Loop_*>,_std::hash<const_spvtools::opt::Loop_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
              *)&local_78,&local_b0);
  }
  if (local_78._M_element_count == 1) {
    pLVar1 = (Loop *)local_78._M_before_begin._M_nxt[1]._M_nxt;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"GetLoopForSubscriptPair found loops.size() != 1.",
               (allocator<char> *)&local_b0);
    PrintDebug(this,&local_40);
    std::__cxx11::string::_M_dispose();
    pLVar1 = (Loop *)0x0;
  }
  std::
  _Hashtable<const_spvtools::opt::Loop_*,_const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>,_std::__detail::_Identity,_std::equal_to<const_spvtools::opt::Loop_*>,_std::hash<const_spvtools::opt::Loop_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_78);
  std::
  _Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  ::~_Vector_base(&local_a8);
  std::
  _Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  ::~_Vector_base(&local_90);
  return pLVar1;
}

Assistant:

const Loop* LoopDependenceAnalysis::GetLoopForSubscriptPair(
    const std::pair<SENode*, SENode*>& subscript_pair) {
  // Collect all the SERecurrentNodes.
  std::vector<SERecurrentNode*> source_nodes =
      std::get<0>(subscript_pair)->CollectRecurrentNodes();
  std::vector<SERecurrentNode*> destination_nodes =
      std::get<1>(subscript_pair)->CollectRecurrentNodes();

  // Collect all the loops stored by the SERecurrentNodes.
  std::unordered_set<const Loop*> loops{};
  for (auto source_nodes_it = source_nodes.begin();
       source_nodes_it != source_nodes.end(); ++source_nodes_it) {
    loops.insert((*source_nodes_it)->GetLoop());
  }
  for (auto destination_nodes_it = destination_nodes.begin();
       destination_nodes_it != destination_nodes.end();
       ++destination_nodes_it) {
    loops.insert((*destination_nodes_it)->GetLoop());
  }

  // If we didn't find 1 loop |subscript_pair| is a subscript over multiple or 0
  // loops. We don't handle this so return nullptr.
  if (loops.size() != 1) {
    PrintDebug("GetLoopForSubscriptPair found loops.size() != 1.");
    return nullptr;
  }
  return *loops.begin();
}